

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_transaction_internal.cpp
# Opt level: O2

void cfd::TransactionContextUtil::AddSign<cfd::ConfidentialTransactionContext>
               (ConfidentialTransactionContext *transaction,OutPoint *outpoint,
               vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_> *sign_params,
               bool insert_witness,bool clear_stack)

{
  pointer pSVar1;
  bool bVar2;
  uint32_t uVar3;
  CfdException *pCVar4;
  pointer pSVar5;
  byte bVar6;
  ScriptElement *element;
  ScriptBuilder builder;
  Script script;
  Txid txid;
  ScriptOperator op_code;
  Script local_180 [5];
  ScriptWitness local_50;
  
  if (transaction == (ConfidentialTransactionContext *)0x0) {
    pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string((string *)&op_code,"Empty transaction.",(allocator *)&script);
    core::CfdException::CfdException(pCVar4,kCfdIllegalArgumentError,(string *)&op_code);
    __cxa_throw(pCVar4,&core::CfdException::typeinfo,core::CfdException::~CfdException);
  }
  if ((sign_params->super__Vector_base<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>).
      _M_impl.super__Vector_impl_data._M_start !=
      (sign_params->super__Vector_base<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>).
      _M_impl.super__Vector_impl_data._M_finish) {
    bVar2 = core::OutPoint::IsValid(outpoint);
    if (bVar2) {
      if (insert_witness) {
        bVar6 = 0;
      }
      else {
        pSVar1 = (sign_params->
                 super__Vector_base<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>).
                 _M_impl.super__Vector_impl_data._M_finish;
        bVar6 = 0;
        for (pSVar5 = (sign_params->
                      super__Vector_base<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>).
                      _M_impl.super__Vector_impl_data._M_start; pSVar5 != pSVar1;
            pSVar5 = pSVar5 + 1) {
          bVar2 = SignParameter::IsOpCode(pSVar5);
          if (bVar2) {
            SignParameter::GetOpCode(&op_code,pSVar5);
            bVar2 = core::ScriptOperator::IsPushOperator(&op_code);
            bVar6 = bVar6 | bVar2;
            core::ScriptOperator::~ScriptOperator(&op_code);
          }
        }
      }
      core::OutPoint::GetTxid(&txid,outpoint);
      uVar3 = core::OutPoint::GetVout(outpoint);
      uVar3 = (*(transaction->super_ConfidentialTransaction).super_AbstractTransaction.
                _vptr_AbstractTransaction[2])(transaction,&txid,(ulong)uVar3);
      if (insert_witness) {
        if (clear_stack) {
          core::ConfidentialTransaction::RemoveScriptWitnessStackAll
                    (&transaction->super_ConfidentialTransaction,uVar3);
        }
        pSVar1 = (sign_params->
                 super__Vector_base<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>).
                 _M_impl.super__Vector_impl_data._M_finish;
        for (pSVar5 = (sign_params->
                      super__Vector_base<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>).
                      _M_impl.super__Vector_impl_data._M_start; pSVar5 != pSVar1;
            pSVar5 = pSVar5 + 1) {
          SignParameter::ConvertToSignature((ByteData *)&op_code,pSVar5);
          core::ConfidentialTransaction::AddScriptWitnessStack
                    (&local_50,&transaction->super_ConfidentialTransaction,uVar3,
                     (ByteData *)&op_code);
          core::ScriptWitness::~ScriptWitness(&local_50);
          std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                    ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&op_code);
        }
      }
      else {
        core::Script::Script(&script);
        if (!clear_stack) {
          core::ConfidentialTransaction::GetTxIn
                    ((ConfidentialTxInReference *)&op_code,
                     &transaction->super_ConfidentialTransaction,uVar3);
          core::Script::Script((Script *)&builder,local_180);
          core::Script::operator=(&script,(Script *)&builder);
          core::Script::~Script((Script *)&builder);
          core::ConfidentialTxInReference::~ConfidentialTxInReference
                    ((ConfidentialTxInReference *)&op_code);
        }
        builder._vptr_ScriptBuilder = (_func_int **)&PTR__ScriptBuilder_00647848;
        builder.script_byte_array_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        builder.script_byte_array_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        builder.script_byte_array_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        core::Script::GetElementList
                  ((vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_> *)
                   &op_code,&script);
        for (; (ScriptElement *)op_code._vptr_ScriptOperator !=
               (ScriptElement *)CONCAT44(op_code._12_4_,op_code.data_type_);
            op_code._vptr_ScriptOperator = (_func_int **)((long)op_code._vptr_ScriptOperator + 0x60)
            ) {
          core::ScriptBuilder::AppendElement(&builder,(ScriptElement *)op_code._vptr_ScriptOperator)
          ;
        }
        std::vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>::~vector
                  ((vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_> *)
                   &op_code);
        pSVar1 = (sign_params->
                 super__Vector_base<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>).
                 _M_impl.super__Vector_impl_data._M_finish;
        for (pSVar5 = (sign_params->
                      super__Vector_base<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>).
                      _M_impl.super__Vector_impl_data._M_start; pSVar5 != pSVar1;
            pSVar5 = pSVar5 + 1) {
          if ((bVar6 == 0) || (bVar2 = SignParameter::IsOpCode(pSVar5), !bVar2)) {
            SignParameter::ConvertToSignature((ByteData *)&op_code,pSVar5);
            core::ScriptBuilder::AppendData(&builder,(ByteData *)&op_code);
            std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                      ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&op_code);
          }
          else {
            SignParameter::GetOpCode(&op_code,pSVar5);
            core::ScriptBuilder::AppendOperator(&builder,&op_code);
            core::ScriptOperator::~ScriptOperator(&op_code);
          }
        }
        core::ScriptBuilder::Build((Script *)&op_code,&builder);
        core::ConfidentialTransaction::SetUnlockingScript
                  (&transaction->super_ConfidentialTransaction,uVar3,(Script *)&op_code);
        core::Script::~Script((Script *)&op_code);
        core::ScriptBuilder::~ScriptBuilder(&builder);
        core::Script::~Script(&script);
      }
      core::Txid::~Txid(&txid);
      return;
    }
    op_code._vptr_ScriptOperator = (_func_int **)0x4feb8d;
    op_code.data_type_ = 0x101;
    op_code.text_data_._M_dataplus._M_p = "AddSign";
    core::logger::warn<>((CfdSourceLocation *)&op_code,"Failed to AddSign. Invalid outpoint.");
    pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string((string *)&op_code,"Invalid outpoint.",(allocator *)&script);
    core::CfdException::CfdException(pCVar4,kCfdIllegalArgumentError,(string *)&op_code);
    __cxa_throw(pCVar4,&core::CfdException::typeinfo,core::CfdException::~CfdException);
  }
  op_code._vptr_ScriptOperator = (_func_int **)0x4feb8d;
  op_code.data_type_ = kOpSuccess252;
  op_code.text_data_._M_dataplus._M_p = "AddSign";
  core::logger::warn<>((CfdSourceLocation *)&op_code,"Failed to AddSign. Empty sign_params.");
  pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string((string *)&op_code,"Empty sign_params.",(allocator *)&script);
  core::CfdException::CfdException(pCVar4,kCfdIllegalArgumentError,(string *)&op_code);
  __cxa_throw(pCVar4,&core::CfdException::typeinfo,core::CfdException::~CfdException);
}

Assistant:

void TransactionContextUtil::AddSign(
    Tx* transaction, const OutPoint& outpoint,
    const std::vector<SignParameter>& sign_params, bool insert_witness,
    bool clear_stack) {
  if (transaction == nullptr) {
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "Empty transaction.");
  }
  if (sign_params.empty()) {
    warn(CFD_LOG_SOURCE, "Failed to AddSign. Empty sign_params.");
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "Empty sign_params.");
  }
  if (!outpoint.IsValid()) {
    warn(CFD_LOG_SOURCE, "Failed to AddSign. Invalid outpoint.");
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "Invalid outpoint.");
  }

  bool has_op_code = false;
  if (!insert_witness) {
    for (const SignParameter& sign_param : sign_params) {
      if (sign_param.IsOpCode()) {
        ScriptOperator op_code = sign_param.GetOpCode();
        if (op_code.IsPushOperator()) {
          has_op_code = true;
        }
      }
    }
  }
  Txid txid = outpoint.GetTxid();
  uint32_t vout = outpoint.GetVout();
  uint32_t txin_index = transaction->GetTxInIndex(txid, vout);

  if (insert_witness) {
    if (clear_stack) {
      transaction->RemoveScriptWitnessStackAll(txin_index);
    }
    for (const SignParameter& sign_param : sign_params) {
      transaction->AddScriptWitnessStack(
          txin_index, sign_param.ConvertToSignature());
    }
  } else {
    Script script;
    if (!clear_stack) {
      script = transaction->GetTxIn(txin_index).GetUnlockingScript();
    }
    ScriptBuilder builder;
    for (const auto& element : script.GetElementList()) {
      builder.AppendElement(element);
    }
    for (const SignParameter& sign_param : sign_params) {
      if (has_op_code && sign_param.IsOpCode()) {
        // Checking push-operator is performed at the time of registration.
        builder.AppendOperator(sign_param.GetOpCode());
      } else {
        builder.AppendData(sign_param.ConvertToSignature());
      }
    }
    transaction->SetUnlockingScript(txin_index, builder.Build());
  }
}